

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

Rational<long> Common::Number::gcd<long>(long *lhs,long *rhs)

{
  Type local_30;
  long *local_28;
  long *rhs_local;
  long *lhs_local;
  
  local_28 = rhs;
  rhs_local = lhs;
  local_30 = Rational<long>::gcd(*lhs,*rhs);
  Rational<long>::Rational((Rational<long> *)&lhs_local,&local_30);
  return _lhs_local;
}

Assistant:

const Rational<T> gcd(const T &lhs, const T &rhs) {
		return Rational<T>::gcd(lhs, rhs);
	}